

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<char>::assign<char_const*,q20::identity>
          (QArrayDataPointer<char> *this,char *first,char *last)

{
  Data *pDVar1;
  QArrayData *data;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (long)last - (long)first;
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    lVar3 = (pDVar1->super_QArrayData).alloc;
    if (lVar5 <= lVar3 && (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2
       ) goto LAB_00221833;
    if (lVar3 <= lVar5) {
      lVar3 = lVar5;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar5 = lVar3;
    }
  }
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = (char *)QArrayData::allocate1(&local_40,lVar5,KeepSize);
  data = &this->d->super_QArrayData;
  this->d = (Data *)local_40;
  this->ptr = pcVar2;
  this->size = 0;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
LAB_00221833:
  pcVar2 = this->ptr;
  lVar5 = (long)pcVar2 -
          ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
  if (this->d == (Data *)0x0) {
    lVar5 = 0;
  }
  lVar3 = this->size;
  pcVar6 = pcVar2 + -lVar5;
  if (lVar5 != 0) {
    lVar4 = -lVar5;
    this->ptr = pcVar2 + -lVar5;
    do {
      if (first == last) {
        pcVar6 = pcVar2 + lVar4;
        goto LAB_002218d4;
      }
      pcVar2[lVar4] = *first;
      first = first + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    this->size = this->size + lVar5;
    pcVar6 = pcVar2;
  }
  if (first != last) {
    lVar5 = 0;
    do {
      if (lVar3 == lVar5) {
        memmove(pcVar2 + lVar3,first + lVar5,(size_t)(last + (-lVar5 - (long)first)));
        pcVar6 = pcVar2 + (long)(last + ((lVar3 - (long)first) - lVar5));
        goto LAB_002218d4;
      }
      pcVar6 = first + lVar5;
      pcVar2[lVar5] = *pcVar6;
      lVar5 = lVar5 + 1;
    } while (pcVar6 + 1 != last);
    pcVar6 = pcVar2 + lVar5;
  }
LAB_002218d4:
  this->size = (long)pcVar6 - (long)this->ptr;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }